

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Type * __thiscall hdc::Parser::parse_type(Parser *this)

{
  bool bVar1;
  PointerType *this_00;
  Expression *expression;
  IntType *pIVar2;
  reference pTVar3;
  IntType *local_20;
  Type *type;
  Expression *expr;
  Parser *this_local;
  
  local_20 = (IntType *)0x0;
  bVar1 = match(this,TK_INT);
  if (bVar1) {
    local_20 = (IntType *)operator_new(0x78);
    pTVar3 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    IntType::IntType(local_20,pTVar3);
  }
  else {
    bVar1 = match(this,TK_UINT);
    if (bVar1) {
      local_20 = (IntType *)operator_new(0x78);
      pTVar3 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      UIntType::UIntType((UIntType *)local_20,pTVar3);
    }
    else {
      bVar1 = match(this,TK_FLOAT);
      if (bVar1) {
        local_20 = (IntType *)operator_new(0x78);
        pTVar3 = __gnu_cxx::
                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                 ::operator*(&this->matched);
        FloatType::FloatType((FloatType *)local_20,pTVar3);
      }
      else {
        bVar1 = match(this,TK_DOUBLE);
        if (bVar1) {
          local_20 = (IntType *)operator_new(0x78);
          pTVar3 = __gnu_cxx::
                   __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                   ::operator*(&this->matched);
          DoubleType::DoubleType((DoubleType *)local_20,pTVar3);
        }
        else {
          bVar1 = match(this,TK_SHORT);
          if (bVar1) {
            local_20 = (IntType *)operator_new(0x78);
            pTVar3 = __gnu_cxx::
                     __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                     ::operator*(&this->matched);
            ShortType::ShortType((ShortType *)local_20,pTVar3);
          }
          else {
            bVar1 = match(this,TK_USHORT);
            if (bVar1) {
              local_20 = (IntType *)operator_new(0x78);
              pTVar3 = __gnu_cxx::
                       __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                       ::operator*(&this->matched);
              UShortType::UShortType((UShortType *)local_20,pTVar3);
            }
            else {
              bVar1 = match(this,TK_LONG);
              if (bVar1) {
                local_20 = (IntType *)operator_new(0x78);
                pTVar3 = __gnu_cxx::
                         __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                         ::operator*(&this->matched);
                LongType::LongType((LongType *)local_20,pTVar3);
              }
              else {
                bVar1 = match(this,TK_ULONG);
                if (bVar1) {
                  local_20 = (IntType *)operator_new(0x78);
                  pTVar3 = __gnu_cxx::
                           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                           ::operator*(&this->matched);
                  ULongType::ULongType((ULongType *)local_20,pTVar3);
                }
                else {
                  bVar1 = match(this,TK_CHAR);
                  if (bVar1) {
                    local_20 = (IntType *)operator_new(0x78);
                    pTVar3 = __gnu_cxx::
                             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                             ::operator*(&this->matched);
                    CharType::CharType((CharType *)local_20,pTVar3);
                  }
                  else {
                    bVar1 = match(this,TK_UCHAR);
                    if (bVar1) {
                      local_20 = (IntType *)operator_new(0x78);
                      pTVar3 = __gnu_cxx::
                               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                               ::operator*(&this->matched);
                      UCharType::UCharType((UCharType *)local_20,pTVar3);
                    }
                    else {
                      bVar1 = match(this,TK_SYMBOL);
                      if (bVar1) {
                        local_20 = (IntType *)operator_new(0x78);
                        pTVar3 = __gnu_cxx::
                                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                 ::operator*(&this->matched);
                        SymbolType::SymbolType((SymbolType *)local_20,pTVar3);
                      }
                      else {
                        bVar1 = match(this,TK_VOID);
                        if (bVar1) {
                          local_20 = (IntType *)operator_new(0x78);
                          pTVar3 = __gnu_cxx::
                                   __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                   ::operator*(&this->matched);
                          VoidType::VoidType((VoidType *)local_20,pTVar3);
                        }
                        else {
                          bVar1 = match(this,TK_BOOL);
                          if (bVar1) {
                            local_20 = (IntType *)operator_new(0x78);
                            pTVar3 = __gnu_cxx::
                                     __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                     ::operator*(&this->matched);
                            BoolType::BoolType((BoolType *)local_20,pTVar3);
                          }
                          else {
                            bVar1 = match(this,TK_I8);
                            if (bVar1) {
                              local_20 = (IntType *)operator_new(0x78);
                              pTVar3 = __gnu_cxx::
                                       __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                       ::operator*(&this->matched);
                              Int8Type::Int8Type((Int8Type *)local_20,pTVar3);
                            }
                            else {
                              bVar1 = match(this,TK_I16);
                              if (bVar1) {
                                local_20 = (IntType *)operator_new(0x78);
                                pTVar3 = __gnu_cxx::
                                         __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                         ::operator*(&this->matched);
                                Int16Type::Int16Type((Int16Type *)local_20,pTVar3);
                              }
                              else {
                                bVar1 = match(this,TK_I32);
                                if (bVar1) {
                                  local_20 = (IntType *)operator_new(0x78);
                                  pTVar3 = __gnu_cxx::
                                           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                           ::operator*(&this->matched);
                                  Int32Type::Int32Type((Int32Type *)local_20,pTVar3);
                                }
                                else {
                                  bVar1 = match(this,TK_I64);
                                  if (bVar1) {
                                    local_20 = (IntType *)operator_new(0x78);
                                    pTVar3 = __gnu_cxx::
                                             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                             ::operator*(&this->matched);
                                    Int64Type::Int64Type((Int64Type *)local_20,pTVar3);
                                  }
                                  else {
                                    bVar1 = match(this,TK_U8);
                                    if (bVar1) {
                                      local_20 = (IntType *)operator_new(0x78);
                                      pTVar3 = __gnu_cxx::
                                               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                               ::operator*(&this->matched);
                                      UInt8Type::UInt8Type((UInt8Type *)local_20,pTVar3);
                                    }
                                    else {
                                      bVar1 = match(this,TK_U16);
                                      if (bVar1) {
                                        local_20 = (IntType *)operator_new(0x78);
                                        pTVar3 = __gnu_cxx::
                                                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                                 ::operator*(&this->matched);
                                        UInt16Type::UInt16Type((UInt16Type *)local_20,pTVar3);
                                      }
                                      else {
                                        bVar1 = match(this,TK_U32);
                                        if (bVar1) {
                                          local_20 = (IntType *)operator_new(0x78);
                                          pTVar3 = __gnu_cxx::
                                                                                                      
                                                  __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                                  ::operator*(&this->matched);
                                          UInt32Type::UInt32Type((UInt32Type *)local_20,pTVar3);
                                        }
                                        else {
                                          bVar1 = match(this,TK_U64);
                                          if (bVar1) {
                                            local_20 = (IntType *)operator_new(0x78);
                                            pTVar3 = __gnu_cxx::
                                                                                                          
                                                  __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                                  ::operator*(&this->matched);
                                            UInt64Type::UInt64Type((UInt64Type *)local_20,pTVar3);
                                          }
                                          else {
                                            bVar1 = lookahead(this,TK_ID);
                                            if (bVar1) {
                                              local_20 = (IntType *)parse_named_type(this);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  while( true ) {
    while( true ) {
      while( true ) {
        if (local_20 == (IntType *)0x0) {
          return (Type *)0x0;
        }
        bVar1 = match(this,TK_TIMES);
        if (!bVar1) break;
        pIVar2 = (IntType *)operator_new(0x50);
        pTVar3 = __gnu_cxx::
                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                 ::operator*(&this->matched);
        PointerType::PointerType((PointerType *)pIVar2,(Type *)local_20,pTVar3);
        local_20 = pIVar2;
      }
      bVar1 = match(this,TK_POWER);
      if (!bVar1) break;
      pIVar2 = (IntType *)operator_new(0x50);
      this_00 = (PointerType *)operator_new(0x50);
      pTVar3 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      PointerType::PointerType(this_00,(Type *)local_20,pTVar3);
      pTVar3 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      PointerType::PointerType((PointerType *)pIVar2,(Type *)this_00,pTVar3);
      local_20 = pIVar2;
    }
    bVar1 = match(this,TK_LEFT_SQUARE_BRACKET);
    if (!bVar1) break;
    bVar1 = match(this,TK_RIGHT_CURLY_BRACKET);
    if (bVar1) {
      pIVar2 = (IntType *)operator_new(0x58);
      pTVar3 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      ArrayType::ArrayType((ArrayType *)pIVar2,(Type *)local_20,pTVar3);
      local_20 = pIVar2;
    }
    else {
      expression = parse_expression(this);
      expect(this,TK_RIGHT_SQUARE_BRACKET);
      pIVar2 = (IntType *)operator_new(0x58);
      pTVar3 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      ArrayType::ArrayType((ArrayType *)pIVar2,(Type *)local_20,expression,pTVar3);
      local_20 = pIVar2;
    }
  }
  return (Type *)local_20;
}

Assistant:

Type* Parser::parse_type() {
    Expression* expr = nullptr;
    Type* type = nullptr;

    if (match(TK_INT)) {
        type = new IntType(*matched);
    } else if (match(TK_UINT)) {
        type = new UIntType(*matched);
    } else if (match(TK_FLOAT)) {
        type = new FloatType(*matched);
    } else if (match(TK_DOUBLE)) {
        type = new DoubleType(*matched);
    } else if (match(TK_SHORT)) {
        type = new ShortType(*matched);
    } else if (match(TK_USHORT)) {
        type = new UShortType(*matched);
    } else if (match(TK_LONG)) {
        type = new LongType(*matched);
    } else if (match(TK_ULONG)) {
        type = new ULongType(*matched);
    } else if (match(TK_CHAR)) {
        type = new CharType(*matched);
    } else if (match(TK_UCHAR)) {
        type = new UCharType(*matched);
    } else if (match(TK_SYMBOL)) {
        type = new SymbolType(*matched);
    } else if (match(TK_VOID)) {
        type = new VoidType(*matched);
    } else if (match(TK_BOOL)) {
        type = new BoolType(*matched);
    } else if (match(TK_I8)) {
        type = new Int8Type(*matched);
    } else if (match(TK_I16)) {
        type = new Int16Type(*matched);
    } else if (match(TK_I32)) {
        type = new Int32Type(*matched);
    } else if (match(TK_I64)) {
        type = new Int64Type(*matched);
    } else if (match(TK_U8)) {
        type = new UInt8Type(*matched);
    } else if (match(TK_U16)) {
        type = new UInt16Type(*matched);
    } else if (match(TK_U32)) {
        type = new UInt32Type(*matched);
    } else if (match(TK_U64)) {
        type = new UInt64Type(*matched);
    } else if (lookahead(TK_ID)) {
        type = parse_named_type();
    }

    while (type != NULL) {
        if (match(TK_TIMES)) {
            type = new PointerType(type, *matched);
        } else if (match(TK_POWER)) {
            type = new PointerType(new PointerType(type, *matched), *matched);
        } else if (match(TK_LEFT_SQUARE_BRACKET)) {
            if (match(TK_RIGHT_CURLY_BRACKET)) {
                type = new ArrayType(type, *matched);
            } else {
                expr = parse_expression();
                expect(TK_RIGHT_SQUARE_BRACKET);
                type = new ArrayType(type, expr, *matched);
            }
        } else {
            break;
        }
    }

    return type;
}